

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::DetectMapConflicts
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  byte *pbVar1;
  ushort *puVar2;
  char *pcVar3;
  uint uVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  undefined8 uVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  ExtensionRange *pEVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  undefined1 uVar42;
  bool bVar43;
  ushort uVar44;
  uint64_t uVar45;
  size_t sVar46;
  slot_type *ppDVar47;
  anon_union_8_1_a8a14541_for_iterator_2 aVar48;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  Nonnull<const_char_*> failure_msg;
  ExtensionRange *pEVar49;
  Descriptor *rhs;
  Descriptor *rhs_00;
  Descriptor *rhs_01;
  Descriptor *rhs_02;
  uint64_t v;
  ulong uVar50;
  CommonFields *common;
  anon_union_8_1_a8a14541_for_iterator_2 key;
  Descriptor *pDVar51;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *prVar52;
  PolicyFunctions *in_R9;
  size_t cap_1;
  long lVar53;
  long lVar54;
  uint uVar55;
  size_t cap_4;
  EnumDescriptor *pEVar56;
  ulong uVar57;
  FieldDescriptor *this_00;
  undefined4 uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  __m128i match;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  iterator iVar65;
  iterator iVar66;
  iterator iVar67;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  FindInfo target;
  Descriptor *nested;
  iterator iter;
  DescriptorsByNameSet<Descriptor> seen_types;
  Descriptor *local_128;
  long local_120;
  undefined1 local_118 [16];
  CommonFields local_108;
  Descriptor *local_e8;
  FeatureSet *local_e0;
  FieldDescriptor *local_d8;
  DescriptorProto *local_d0;
  DescriptorBuilder *local_c8;
  EnumDescriptor *local_c0;
  undefined8 local_b8;
  byte bStack_b0;
  byte bStack_af;
  byte bStack_ae;
  byte bStack_ad;
  byte bStack_ac;
  byte bStack_ab;
  byte bStack_aa;
  byte bStack_a9;
  undefined1 local_a8 [16];
  RepeatedPtrFieldBase *local_98;
  long local_90;
  VoidPtr local_88;
  code *pcStack_80;
  VoidPtr local_78;
  code *pcStack_70;
  VoidPtr local_68;
  code *pcStack_60;
  VoidPtr local_58;
  code *pcStack_50;
  byte local_48;
  byte bStack_47;
  byte bStack_46;
  byte bStack_45;
  byte bStack_44;
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  byte bStack_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  byte bStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  
  local_108.capacity_ = 1;
  local_108.size_ = 0;
  local_e8 = message;
  local_d0 = proto;
  local_c8 = this;
  if (0 < message->nested_type_count_) {
    local_98 = (RepeatedPtrFieldBase *)((long)&proto->field_0 + 0x20);
    pEVar56 = (EnumDescriptor *)0x0;
    do {
      local_90 = (long)pEVar56 * 0xa0;
      local_128 = message->nested_types_ + (long)pEVar56;
      local_c0 = pEVar56;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
      ::AssertOnFind<google::protobuf::Descriptor_const*>
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                  *)&local_108,&local_128);
      if ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
           *)local_108.capacity_ ==
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
           *)0x1) {
        if (local_108.size_ < (FileDescriptor *)0x2) {
          absl::lts_20250127::container_internal::CommonFields::AssertInSooMode(&local_108);
          local_108.size_ = 2;
          aVar48.slot_ = absl::lts_20250127::container_internal::
                         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                         ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                     *)&local_108);
          iVar66.field_1.slot_ = aVar48.slot_;
          iVar66.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
          goto LAB_001cf789;
        }
        ppDVar47 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                               *)&local_108);
        bVar43 = anon_unknown_24::DescriptorsByNameEq<google::protobuf::Descriptor>::operator()
                           ((DescriptorsByNameEq<google::protobuf::Descriptor> *)*ppDVar47,local_128
                            ,rhs_00);
        if (!bVar43) {
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::resize_impl(&local_108,3);
          puVar2 = (ushort *)(local_128->all_names_).payload_;
          uVar50 = (ulong)*puVar2;
          uVar45 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                             (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                              (long)puVar2 + ~uVar50,uVar50);
          uVar50 = (uVar45 ^ uVar50) * -0x234dd359734ecb13;
          sVar46 = absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                             (uVar50 >> 0x38 | (uVar50 & 0xff000000000000) >> 0x28 |
                              (uVar50 & 0xff0000000000) >> 0x18 | (uVar50 & 0xff00000000) >> 8 |
                              (uVar50 & 0xff000000) << 8 | (uVar50 & 0xff0000) << 0x18 |
                              (uVar50 & 0xff00) << 0x28 | uVar50 << 0x38,8,&local_108);
          goto LAB_001cf773;
        }
        aVar48.slot_ = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                   *)&local_108);
        iVar65.field_1.slot_ = aVar48.slot_;
        iVar65.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
LAB_001cf674:
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::iterator::operator*((iterator *)iVar65.ctrl_);
        message = local_e8;
        if ((((*iVar65.field_1.slot_)->options_->field_0)._impl_.map_entry_ != false) ||
           ((local_128->options_->field_0)._impl_.map_entry_ == true)) {
          pcVar3 = (local_e8->all_names_).payload_;
          element_name._M_len = (ulong)*(ushort *)(pcVar3 + 2);
          element_name._M_str = pcVar3 + ~element_name._M_len;
          local_58.obj = local_118;
          local_118._0_8_ = &local_128;
          pcStack_50 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          make_error.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          make_error.ptr_.obj = local_58.obj;
          AddError(local_c8,element_name,&local_d0->super_Message,NAME,make_error);
          break;
        }
      }
      else {
        pEVar25 = local_b8;
        if ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
             *)local_108.capacity_ ==
            (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
             *)0x0) goto LAB_001cfdc2;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::prefetch_heap_block
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)local_108.capacity_);
        puVar2 = (ushort *)(local_128->all_names_).payload_;
        uVar50 = (ulong)*puVar2;
        uVar45 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                           (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                            (long)puVar2 + ~uVar50,uVar50);
        uVar16 = local_108.heap_or_soo_.heap.control;
        sVar46 = local_108.capacity_;
        if (((ulong)(local_108.capacity_ + 1) & local_108.capacity_) != 0) goto LAB_001cfde1;
        uVar50 = (uVar45 ^ uVar50) * -0x234dd359734ecb13;
        common = (CommonFields *)
                 (uVar50 >> 0x38 | (uVar50 & 0xff000000000000) >> 0x28 |
                  (uVar50 & 0xff0000000000) >> 0x18 | (uVar50 & 0xff00000000) >> 8 |
                  (uVar50 & 0xff000000) << 8 | (uVar50 & 0xff0000) << 0x18 |
                  (uVar50 & 0xff00) << 0x28 | uVar50 << 0x38);
        uVar57 = (ulong)common >> 7 ^ (ulong)local_108.heap_or_soo_.heap.control >> 0xc;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)local_108.capacity_);
        uVar42 = (undefined1)(uVar50 >> 0x38);
        auVar59 = ZEXT216(CONCAT11(uVar42,uVar42) & 0x7f7f);
        auVar59 = pshuflw(auVar59,auVar59,0);
        uVar58 = auVar59._0_4_;
        auVar59._4_4_ = uVar58;
        auVar59._0_4_ = uVar58;
        auVar59._8_4_ = uVar58;
        auVar59._12_4_ = uVar58;
        local_d8 = (FieldDescriptor *)0x0;
        local_e0 = (FeatureSet *)uVar16;
        while( true ) {
          uVar57 = uVar57 & sVar46;
          pbVar1 = (byte *)((long)&(local_e0->super_Message).super_MessageLite._vptr_MessageLite +
                           uVar57);
          auVar60[0] = -(auVar59[0] == *pbVar1);
          auVar60[1] = -(auVar59[1] == pbVar1[1]);
          auVar60[2] = -(auVar59[2] == pbVar1[2]);
          auVar60[3] = -(auVar59[3] == pbVar1[3]);
          auVar60[4] = -(auVar59[4] == pbVar1[4]);
          auVar60[5] = -(auVar59[5] == pbVar1[5]);
          auVar60[6] = -(auVar59[6] == pbVar1[6]);
          auVar60[7] = -(auVar59[7] == pbVar1[7]);
          auVar60[8] = -(auVar59[8] == pbVar1[8]);
          auVar60[9] = -(auVar59[9] == pbVar1[9]);
          auVar60[10] = -(auVar59[10] == pbVar1[10]);
          auVar60[0xb] = -(auVar59[0xb] == pbVar1[0xb]);
          auVar60[0xc] = -(auVar59[0xc] == pbVar1[0xc]);
          auVar60[0xd] = -(auVar59[0xd] == pbVar1[0xd]);
          auVar60[0xe] = -(auVar59[0xe] == pbVar1[0xe]);
          auVar60[0xf] = -(auVar59[0xf] == pbVar1[0xf]);
          uVar44 = (ushort)(SUB161(auVar60 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar60[0xf] >> 7) << 0xf;
          uVar55 = (uint)uVar44;
          bVar8 = *pbVar1;
          bVar9 = pbVar1[1];
          bVar10 = pbVar1[2];
          bVar11 = pbVar1[3];
          bVar12 = pbVar1[4];
          bVar13 = pbVar1[5];
          bVar14 = pbVar1[6];
          bVar15 = pbVar1[7];
          bVar26 = pbVar1[8];
          bVar27 = pbVar1[9];
          bVar28 = pbVar1[10];
          bVar29 = pbVar1[0xb];
          bVar30 = pbVar1[0xc];
          bVar31 = pbVar1[0xd];
          bVar32 = pbVar1[0xe];
          bVar33 = pbVar1[0xf];
          prVar52 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     *)local_108.capacity_;
          uVar16 = local_108.heap_or_soo_.heap.slot_array;
          pEVar25 = local_b8;
          bVar17 = bStack_b0;
          bVar18 = bStack_af;
          bVar19 = bStack_ae;
          bVar20 = bStack_ad;
          bVar21 = bStack_ac;
          bVar22 = bStack_ab;
          bVar23 = bStack_aa;
          bVar24 = bStack_a9;
          local_b8 = *(ExtensionRange **)pbVar1;
          while (bStack_a9 = bVar33, bStack_aa = bVar32, bStack_ab = bVar31, bStack_ac = bVar30,
                bStack_ad = bVar29, bStack_ae = bVar28, bStack_af = bVar27, bStack_b0 = bVar26,
                local_108.capacity_ = (size_t)prVar52,
                local_108.heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)uVar16, uVar44 != 0) {
            uVar4 = 0;
            if (uVar55 != 0) {
              for (; (uVar55 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            local_a8 = auVar59;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::slot_array(prVar52);
            uVar50 = uVar4 + uVar57 & sVar46;
            bVar43 = anon_unknown_24::DescriptorsByNameEq<google::protobuf::Descriptor>::operator()
                               (*(DescriptorsByNameEq<google::protobuf::Descriptor> **)
                                 (uVar16 + uVar50 * 8),local_128,rhs);
            if (bVar43) {
              iVar65 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                      *)&local_108,uVar50);
              goto LAB_001cf674;
            }
            uVar44 = (ushort)(uVar55 - 1) & (ushort)uVar55;
            uVar55 = CONCAT22((short)(uVar55 - 1 >> 0x10),uVar44);
            auVar59 = local_a8;
            bVar8 = (byte)local_b8;
            bVar9 = local_b8._1_1_;
            bVar10 = local_b8._2_1_;
            bVar11 = local_b8._3_1_;
            bVar12 = local_b8._4_1_;
            bVar13 = local_b8._5_1_;
            bVar14 = local_b8._6_1_;
            bVar15 = local_b8._7_1_;
            bVar26 = bStack_b0;
            bVar27 = bStack_af;
            bVar28 = bStack_ae;
            bVar29 = bStack_ad;
            bVar30 = bStack_ac;
            bVar31 = bStack_ab;
            bVar32 = bStack_aa;
            bVar33 = bStack_a9;
            prVar52 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)local_108.capacity_;
            uVar16 = local_108.heap_or_soo_.heap.slot_array;
            pEVar25 = local_b8;
            bVar17 = bStack_b0;
            bVar18 = bStack_af;
            bVar19 = bStack_ae;
            bVar20 = bStack_ad;
            bVar21 = bStack_ac;
            bVar22 = bStack_ab;
            bVar23 = bStack_aa;
            bVar24 = bStack_a9;
          }
          auVar63[0] = -(bVar8 == 0x80);
          auVar63[1] = -(bVar9 == 0x80);
          auVar63[2] = -(bVar10 == 0x80);
          auVar63[3] = -(bVar11 == 0x80);
          auVar63[4] = -(bVar12 == 0x80);
          auVar63[5] = -(bVar13 == 0x80);
          auVar63[6] = -(bVar14 == 0x80);
          auVar63[7] = -(bVar15 == 0x80);
          auVar63[8] = -(bStack_b0 == 0x80);
          auVar63[9] = -(bStack_af == 0x80);
          auVar63[10] = -(bStack_ae == 0x80);
          auVar63[0xb] = -(bStack_ad == 0x80);
          auVar63[0xc] = -(bStack_ac == 0x80);
          auVar63[0xd] = -(bStack_ab == 0x80);
          auVar63[0xe] = -(bStack_aa == 0x80);
          auVar63[0xf] = -(bStack_a9 == 0x80);
          uVar44 = (ushort)(SUB161(auVar63 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar63[0xf] >> 7) << 0xf;
          local_b8 = pEVar25;
          bStack_b0 = bVar17;
          bStack_af = bVar18;
          bStack_ae = bVar19;
          bStack_ad = bVar20;
          bStack_ac = bVar21;
          bStack_ab = bVar22;
          bStack_aa = bVar23;
          bStack_a9 = bVar24;
          if (uVar44 != 0) break;
          if (prVar52 ==
              (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *)0x0) goto LAB_001cfdc2;
          uVar57 = (long)&local_d8->file_ + uVar57;
          local_d8 = (FieldDescriptor *)&local_d8->file_;
          if (prVar52 < local_d8) {
            __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xf7d,
                          "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = const google::protobuf::Descriptor *]"
                         );
          }
        }
        if (prVar52 ==
            (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
             *)0x0) goto LAB_001cfdc2;
        local_e0 = (FeatureSet *)local_108.heap_or_soo_.heap.control;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::control(prVar52);
        bVar43 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                           ((size_t)prVar52,(size_t)common,(ctrl_t *)local_e0);
        if (bVar43) {
          uVar5 = 0xf;
          if (uVar44 != 0) {
            for (; uVar44 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar55 = (ushort)((uVar5 ^ 0xfff0) + 0x11) - 1;
        }
        else {
          uVar55 = 0;
          if (uVar44 != 0) {
            for (; (uVar44 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
            }
          }
        }
        target.probe_length =
             (size_t)absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                     ::GetPolicyFunctions()::value;
        target.offset = (size_t)local_d8;
        sVar46 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                           ((container_internal *)&local_108,common,uVar55 + uVar57 & sVar46,target,
                            in_R9);
LAB_001cf773:
        iVar66 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                *)&local_108,sVar46);
LAB_001cf789:
        sVar46 = local_108.capacity_;
        key = iVar66.field_1;
        this_00 = (FieldDescriptor *)iVar66.ctrl_;
        local_108.capacity_ = 0xffffffffffffff9c;
        *key.slot_ = local_128;
        absl::lts_20250127::container_internal::CommonFields::set_capacity(&local_108,sVar46);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::iterator::operator*((iterator *)this_00);
        aVar48 = key;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
        ::AssertOnFind<google::protobuf::Descriptor_const*>
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&local_108,key.slot_);
        if ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
             *)local_108.capacity_ ==
            (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
             *)0x1) {
          prVar52 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     *)0x1;
          if ((FileDescriptor *)0x1 < local_108.size_) {
            ppDVar47 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                   *)&local_108);
            aVar48.slot_ = (slot_type *)*key.slot_;
            bVar43 = anon_unknown_24::DescriptorsByNameEq<google::protobuf::Descriptor>::operator()
                               ((DescriptorsByNameEq<google::protobuf::Descriptor> *)*ppDVar47,
                                (Descriptor *)aVar48.slot_,rhs_02);
            prVar52 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)local_108.capacity_;
            if (bVar43) {
              aVar48.slot_ = absl::lts_20250127::container_internal::
                             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                             ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                         *)&local_108);
              iVar67.field_1.slot_ = aVar48.slot_;
              iVar67.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
              goto LAB_001cf9bc;
            }
          }
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::AssertNotDebugCapacity(prVar52);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = aVar48;
          iVar67 = (iterator)(auVar7 << 0x40);
        }
        else {
          pEVar25 = local_b8;
          if ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *)local_108.capacity_ ==
              (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *)0x0) {
LAB_001cfdc2:
            local_b8 = pEVar25;
            __assert_fail("cap >= kDefaultCapacity",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xb75,
                          "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
                         );
          }
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::prefetch_heap_block
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)local_108.capacity_);
          puVar2 = (ushort *)((*key.slot_)->all_names_).payload_;
          uVar50 = (ulong)*puVar2;
          pDVar51 = (Descriptor *)((long)puVar2 + ~uVar50);
          uVar45 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                             (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,pDVar51,
                              uVar50);
          uVar16 = local_108.heap_or_soo_.heap.control;
          sVar46 = local_108.capacity_;
          local_d8 = this_00;
          if ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *)local_108.capacity_ ==
              (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *)0x1) {
            __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xe2a,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = const google::protobuf::Descriptor *]"
                         );
          }
          pEVar25 = local_b8;
          if ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *)local_108.capacity_ ==
              (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *)0x0) goto LAB_001cfdc2;
          if (((ulong)(local_108.capacity_ + 1) & local_108.capacity_) != 0) {
LAB_001cfde1:
            __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x14c,
                          "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                         );
          }
          uVar57 = (uVar45 ^ uVar50) * -0x234dd359734ecb13;
          uVar50 = (uVar57 >> 0x38 | (uVar57 & 0xff000000000000) >> 0x28 |
                    (uVar57 & 0xff0000000000) >> 0x18 | (uVar57 & 0xff00000000) >> 8 |
                    (uVar57 & 0xff000000) << 8 | (uVar57 & 0xff0000) << 0x18 |
                    (uVar57 & 0xff00) << 0x28 | uVar57 << 0x38) >> 7 ^
                   (ulong)local_108.heap_or_soo_.heap.control >> 0xc;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     *)local_108.capacity_);
          uVar42 = (undefined1)(uVar57 >> 0x38);
          auVar59 = ZEXT216(CONCAT11(uVar42,uVar42) & 0x7f7f);
          auVar59 = pshuflw(auVar59,auVar59,0);
          uVar58 = auVar59._0_4_;
          auVar62._4_4_ = uVar58;
          auVar62._0_4_ = uVar58;
          auVar62._8_4_ = uVar58;
          auVar62._12_4_ = uVar58;
          pEVar49 = (ExtensionRange *)0x0;
          local_e0 = (FeatureSet *)uVar16;
          while( true ) {
            uVar50 = uVar50 & sVar46;
            pbVar1 = (byte *)((long)&(local_e0->super_Message).super_MessageLite._vptr_MessageLite +
                             uVar50);
            auVar61[0] = -(auVar62[0] == *pbVar1);
            auVar61[1] = -(auVar62[1] == pbVar1[1]);
            auVar61[2] = -(auVar62[2] == pbVar1[2]);
            auVar61[3] = -(auVar62[3] == pbVar1[3]);
            auVar61[4] = -(auVar62[4] == pbVar1[4]);
            auVar61[5] = -(auVar62[5] == pbVar1[5]);
            auVar61[6] = -(auVar62[6] == pbVar1[6]);
            auVar61[7] = -(auVar62[7] == pbVar1[7]);
            auVar61[8] = -(auVar62[8] == pbVar1[8]);
            auVar61[9] = -(auVar62[9] == pbVar1[9]);
            auVar61[10] = -(auVar62[10] == pbVar1[10]);
            auVar61[0xb] = -(auVar62[0xb] == pbVar1[0xb]);
            auVar61[0xc] = -(auVar62[0xc] == pbVar1[0xc]);
            auVar61[0xd] = -(auVar62[0xd] == pbVar1[0xd]);
            auVar61[0xe] = -(auVar62[0xe] == pbVar1[0xe]);
            auVar61[0xf] = -(auVar62[0xf] == pbVar1[0xf]);
            uVar44 = (ushort)(SUB161(auVar61 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar61 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar61 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar61 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar61 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar61 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar61 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar61 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar61 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar61 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar61 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar61 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar61 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar61[0xf] >> 7) << 0xf;
            uVar55 = (uint)uVar44;
            bVar26 = *pbVar1;
            bVar27 = pbVar1[1];
            bVar28 = pbVar1[2];
            bVar29 = pbVar1[3];
            bVar30 = pbVar1[4];
            bVar31 = pbVar1[5];
            bVar32 = pbVar1[6];
            bVar33 = pbVar1[7];
            bVar34 = pbVar1[8];
            bVar35 = pbVar1[9];
            bVar36 = pbVar1[10];
            bVar37 = pbVar1[0xb];
            bVar38 = pbVar1[0xc];
            bVar39 = pbVar1[0xd];
            bVar40 = pbVar1[0xe];
            bVar41 = pbVar1[0xf];
            uVar16 = local_108.heap_or_soo_.heap.slot_array;
            pEVar25 = local_b8;
            bVar8 = local_48;
            bVar9 = bStack_47;
            bVar10 = bStack_46;
            bVar11 = bStack_45;
            bVar12 = bStack_44;
            bVar13 = bStack_43;
            bVar14 = bStack_42;
            bVar15 = bStack_41;
            bVar17 = bStack_40;
            bVar18 = bStack_3f;
            bVar19 = bStack_3e;
            bVar20 = bStack_3d;
            bVar21 = bStack_3c;
            bVar22 = bStack_3b;
            bVar23 = bStack_3a;
            bVar24 = bStack_39;
            while (bStack_39 = bVar41, bStack_3a = bVar40, bStack_3b = bVar39, bStack_3c = bVar38,
                  bStack_3d = bVar37, bStack_3e = bVar36, bStack_3f = bVar35, bStack_40 = bVar34,
                  bStack_41 = bVar33, bStack_42 = bVar32, bStack_43 = bVar31, bStack_44 = bVar30,
                  bStack_45 = bVar29, bStack_46 = bVar28, bStack_47 = bVar27, local_48 = bVar26,
                  local_b8 = pEVar49,
                  local_108.heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)uVar16, uVar44 != 0)
            {
              uVar4 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              local_a8 = auVar62;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                            *)local_108.capacity_);
              uVar57 = uVar4 + uVar50 & sVar46;
              pDVar51 = *key.slot_;
              bVar43 = anon_unknown_24::DescriptorsByNameEq<google::protobuf::Descriptor>::
                       operator()(*(DescriptorsByNameEq<google::protobuf::Descriptor> **)
                                   (uVar16 + uVar57 * 8),pDVar51,rhs_01);
              if (bVar43) {
                iVar67 = absl::lts_20250127::container_internal::
                         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                         ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                        *)&local_108,uVar57);
                goto LAB_001cf9bc;
              }
              uVar44 = (ushort)(uVar55 - 1) & (ushort)uVar55;
              uVar55 = CONCAT22((short)(uVar55 - 1 >> 0x10),uVar44);
              pEVar49 = local_b8;
              auVar62 = local_a8;
              bVar26 = local_48;
              bVar27 = bStack_47;
              bVar28 = bStack_46;
              bVar29 = bStack_45;
              bVar30 = bStack_44;
              bVar31 = bStack_43;
              bVar32 = bStack_42;
              bVar33 = bStack_41;
              bVar34 = bStack_40;
              bVar35 = bStack_3f;
              bVar36 = bStack_3e;
              bVar37 = bStack_3d;
              bVar38 = bStack_3c;
              bVar39 = bStack_3b;
              bVar40 = bStack_3a;
              bVar41 = bStack_39;
              uVar16 = local_108.heap_or_soo_.heap.slot_array;
              pEVar25 = local_b8;
              bVar8 = local_48;
              bVar9 = bStack_47;
              bVar10 = bStack_46;
              bVar11 = bStack_45;
              bVar12 = bStack_44;
              bVar13 = bStack_43;
              bVar14 = bStack_42;
              bVar15 = bStack_41;
              bVar17 = bStack_40;
              bVar18 = bStack_3f;
              bVar19 = bStack_3e;
              bVar20 = bStack_3d;
              bVar21 = bStack_3c;
              bVar22 = bStack_3b;
              bVar23 = bStack_3a;
              bVar24 = bStack_39;
            }
            auVar64[0] = -(local_48 == 0x80);
            auVar64[1] = -(bStack_47 == 0x80);
            auVar64[2] = -(bStack_46 == 0x80);
            auVar64[3] = -(bStack_45 == 0x80);
            auVar64[4] = -(bStack_44 == 0x80);
            auVar64[5] = -(bStack_43 == 0x80);
            auVar64[6] = -(bStack_42 == 0x80);
            auVar64[7] = -(bStack_41 == 0x80);
            auVar64[8] = -(bStack_40 == 0x80);
            auVar64[9] = -(bStack_3f == 0x80);
            auVar64[10] = -(bStack_3e == 0x80);
            auVar64[0xb] = -(bStack_3d == 0x80);
            auVar64[0xc] = -(bStack_3c == 0x80);
            auVar64[0xd] = -(bStack_3b == 0x80);
            auVar64[0xe] = -(bStack_3a == 0x80);
            auVar64[0xf] = -(bStack_39 == 0x80);
            local_48 = bVar8;
            bStack_47 = bVar9;
            bStack_46 = bVar10;
            bStack_45 = bVar11;
            bStack_44 = bVar12;
            bStack_43 = bVar13;
            bStack_42 = bVar14;
            bStack_41 = bVar15;
            bStack_40 = bVar17;
            bStack_3f = bVar18;
            bStack_3e = bVar19;
            bStack_3d = bVar20;
            bStack_3c = bVar21;
            bStack_3b = bVar22;
            bStack_3a = bVar23;
            if ((((((((((((((((auVar64 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar64 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar64 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar64 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar64 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar64 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar64 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar64 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar64 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar64 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar64 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar64 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                bStack_39 == 0x80) break;
            bStack_39 = bVar24;
            if ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 *)local_108.capacity_ ==
                (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 *)0x0) goto LAB_001cfdc2;
            uVar50 = (long)&local_b8->containing_type_ + uVar50;
            pEVar49 = (ExtensionRange *)&local_b8->containing_type_;
            local_b8 = pEVar25;
            if (local_108.capacity_ < pEVar49) {
              __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xe37,
                            "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = const google::protobuf::Descriptor *]"
                           );
            }
          }
          local_b8 = pEVar25;
          bStack_39 = bVar24;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::AssertNotDebugCapacity
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)local_108.capacity_);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = pDVar51;
          iVar67 = (iterator)(auVar6 << 0x40);
        }
LAB_001cf9bc:
        bVar43 = absl::lts_20250127::container_internal::operator==
                           ((iterator *)iVar67.ctrl_,(iterator *)iVar67.field_1.slot_);
        if (!bVar43) {
          __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xfe2,
                        "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>, Args = <const google::protobuf::Descriptor *const &>]"
                       );
        }
      }
      pEVar56 = local_c0;
      message = local_e8;
      if ((long)local_e8->nested_type_count_ <= (long)local_c0) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                ((long)local_c0,(long)local_e8->nested_type_count_,
                                 "index < nested_type_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa8a,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_118);
      }
      pDVar51 = local_e8->nested_types_;
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (local_98,(int)local_c0);
      DetectMapConflicts(local_c8,(Descriptor *)(&pDVar51->super_SymbolBase + local_90),proto_00);
      pEVar56 = (EnumDescriptor *)&pEVar56->field_0x1;
    } while ((long)pEVar56 < (long)message->nested_type_count_);
  }
  if (0 < message->field_count_) {
    lVar53 = 8;
    lVar54 = 0;
    do {
      puVar2 = *(ushort **)(&message->fields_->super_SymbolBase + lVar53);
      local_128 = (Descriptor *)(ulong)*puVar2;
      local_120 = ~(ulong)local_128 + (long)puVar2;
      local_118 = (undefined1  [16])
                  absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                  ::find<std::basic_string_view<char,std::char_traits<char>>>
                            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                              *)&local_108,(key_arg<std::basic_string_view<char>_> *)&local_128);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)local_108.capacity_);
      bVar43 = absl::lts_20250127::container_internal::operator==
                         ((iterator *)local_118._0_8_,(iterator *)local_118._8_8_);
      if (!bVar43) {
        uVar16 = local_118._8_8_;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::iterator::operator*((iterator *)local_118._0_8_);
        if (((*(slot_type *)uVar16)->options_->field_0)._impl_.map_entry_ == true) {
          pcVar3 = (local_e8->all_names_).payload_;
          element_name_00._M_len = (ulong)*(ushort *)(pcVar3 + 2);
          element_name_00._M_str = pcVar3 + ~element_name_00._M_len;
          local_128 = (Descriptor *)local_118;
          pcStack_60 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__1,std::__cxx11::string>
          ;
          make_error_00.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__1,std::__cxx11::string>
          ;
          make_error_00.ptr_.obj = &local_128;
          local_68.obj = &local_128;
          AddError(local_c8,element_name_00,&local_d0->super_Message,NAME,make_error_00);
        }
      }
      lVar54 = lVar54 + 1;
      lVar53 = lVar53 + 0x58;
      message = local_e8;
    } while (lVar54 < local_e8->field_count_);
  }
  if (0 < message->enum_type_count_) {
    lVar53 = 8;
    lVar54 = 0;
    do {
      puVar2 = *(ushort **)(&message->enum_types_->super_SymbolBase + lVar53);
      local_128 = (Descriptor *)(ulong)*puVar2;
      local_120 = ~(ulong)local_128 + (long)puVar2;
      local_118 = (undefined1  [16])
                  absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                  ::find<std::basic_string_view<char,std::char_traits<char>>>
                            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                              *)&local_108,(key_arg<std::basic_string_view<char>_> *)&local_128);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)local_108.capacity_);
      bVar43 = absl::lts_20250127::container_internal::operator==
                         ((iterator *)local_118._0_8_,(iterator *)local_118._8_8_);
      if (!bVar43) {
        uVar16 = local_118._8_8_;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::iterator::operator*((iterator *)local_118._0_8_);
        if (((*(slot_type *)uVar16)->options_->field_0)._impl_.map_entry_ == true) {
          pcVar3 = (local_e8->all_names_).payload_;
          element_name_01._M_len = (ulong)*(ushort *)(pcVar3 + 2);
          element_name_01._M_str = pcVar3 + ~element_name_01._M_len;
          local_128 = (Descriptor *)local_118;
          pcStack_70 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__2,std::__cxx11::string>
          ;
          make_error_01.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__2,std::__cxx11::string>
          ;
          make_error_01.ptr_.obj = &local_128;
          local_78.obj = &local_128;
          AddError(local_c8,element_name_01,&local_d0->super_Message,NAME,make_error_01);
        }
      }
      lVar54 = lVar54 + 1;
      lVar53 = lVar53 + 0x58;
      message = local_e8;
    } while (lVar54 < local_e8->enum_type_count_);
  }
  if (0 < message->oneof_decl_count_) {
    lVar53 = 8;
    lVar54 = 0;
    do {
      puVar2 = *(ushort **)(&message->oneof_decls_->super_SymbolBase + lVar53);
      local_128 = (Descriptor *)(ulong)*puVar2;
      local_120 = ~(ulong)local_128 + (long)puVar2;
      local_118 = (undefined1  [16])
                  absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                  ::find<std::basic_string_view<char,std::char_traits<char>>>
                            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                              *)&local_108,(key_arg<std::basic_string_view<char>_> *)&local_128);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)local_108.capacity_);
      bVar43 = absl::lts_20250127::container_internal::operator==
                         ((iterator *)local_118._0_8_,(iterator *)local_118._8_8_);
      if (!bVar43) {
        uVar16 = local_118._8_8_;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::iterator::operator*((iterator *)local_118._0_8_);
        if (((*(slot_type *)uVar16)->options_->field_0)._impl_.map_entry_ == true) {
          pcVar3 = (local_e8->all_names_).payload_;
          element_name_02._M_len = (ulong)*(ushort *)(pcVar3 + 2);
          element_name_02._M_str = pcVar3 + ~element_name_02._M_len;
          local_128 = (Descriptor *)local_118;
          pcStack_80 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__3,std::__cxx11::string>
          ;
          make_error_02.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__3,std::__cxx11::string>
          ;
          make_error_02.ptr_.obj = &local_128;
          local_88.obj = &local_128;
          AddError(local_c8,element_name_02,&local_d0->super_Message,NAME,make_error_02);
        }
      }
      lVar54 = lVar54 + 1;
      lVar53 = lVar53 + 0x38;
      message = local_e8;
    } while (lVar54 < local_e8->oneof_decl_count_);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)&local_108);
  return;
}

Assistant:

void DescriptorBuilder::DetectMapConflicts(const Descriptor* message,
                                           const DescriptorProto& proto) {
  DescriptorsByNameSet<Descriptor> seen_types;
  for (int i = 0; i < message->nested_type_count(); ++i) {
    const Descriptor* nested = message->nested_type(i);
    auto insert_result = seen_types.insert(nested);
    bool inserted = insert_result.second;
    if (!inserted) {
      if ((*insert_result.first)->options().map_entry() ||
          nested->options().map_entry()) {
        AddError(message->full_name(), proto,
                 DescriptorPool::ErrorCollector::NAME, [&] {
                   return absl::StrCat(
                       "Expanded map entry type ", nested->name(),
                       " conflicts with an existing nested message type.");
                 });
        break;
      }
    }
    // Recursively test on the nested types.
    DetectMapConflicts(message->nested_type(i), proto.nested_type(i));
  }
  // Check for conflicted field names.
  for (int i = 0; i < message->field_count(); ++i) {
    const FieldDescriptor* field = message->field(i);
    auto iter = seen_types.find(field->name());
    if (iter != seen_types.end() && (*iter)->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::StrCat("Expanded map entry type ",
                                     (*iter)->name(),
                                     " conflicts with an existing field.");
               });
    }
  }
  // Check for conflicted enum names.
  for (int i = 0; i < message->enum_type_count(); ++i) {
    const EnumDescriptor* enum_desc = message->enum_type(i);
    auto iter = seen_types.find(enum_desc->name());
    if (iter != seen_types.end() && (*iter)->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::StrCat("Expanded map entry type ",
                                     (*iter)->name(),
                                     " conflicts with an existing enum type.");
               });
    }
  }
  // Check for conflicted oneof names.
  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof_desc = message->oneof_decl(i);
    auto iter = seen_types.find(oneof_desc->name());
    if (iter != seen_types.end() && (*iter)->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::StrCat("Expanded map entry type ",
                                     (*iter)->name(),
                                     " conflicts with an existing oneof type.");
               });
    }
  }
}